

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O2

void build_terminal_node_mappings_single_tree<IsoTree>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *mappings,size_t *n_terminal,
               vector<IsoTree,_std::allocator<IsoTree>_> *tree)

{
  pointer puVar1;
  pointer puVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer puVar5;
  size_t sVar6;
  size_t *psVar7;
  ulong uVar8;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (mappings,((long)(tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                            super__Vector_impl_data._M_start) / 0x70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(mappings);
  puVar2 = (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = (mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar5 = puVar1; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    *puVar5 = 0;
  }
  *n_terminal = 0;
  pIVar3 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  psVar7 = &pIVar3->tree_left;
  sVar6 = 0;
  for (uVar8 = 0; uVar8 < (ulong)(((long)pIVar4 - (long)pIVar3) / 0x70); uVar8 = uVar8 + 1) {
    if (*psVar7 == 0) {
      puVar1[uVar8] = sVar6;
      sVar6 = *n_terminal + 1;
      *n_terminal = sVar6;
    }
    psVar7 = psVar7 + 0xe;
  }
  return;
}

Assistant:

void build_terminal_node_mappings_single_tree(std::vector<size_t> &mappings, size_t &n_terminal, const std::vector<Tree> &tree)
{
    mappings.resize(tree.size());
    mappings.shrink_to_fit();
    std::fill(mappings.begin(), mappings.end(), (size_t)0);
    
    n_terminal = 0;
    for (size_t node = 0; node < tree.size(); node++)
    {
        if (is_terminal_node(tree[node]))
        {
            mappings[node] = n_terminal;
            n_terminal++;
        }
    }
}